

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O3

void __thiscall
t_html_generator::detect_input_encoding(t_html_generator *this,string *str,size_t firstpos)

{
  bool bVar1;
  input_type iVar2;
  
  bVar1 = is_utf8_sequence(this,str,firstpos);
  if (bVar1) {
    pdebug("Input seems to be already UTF-8 encoded");
    iVar2 = INPUT_UTF8;
  }
  else {
    pwarning(1,"Input is not UTF-8, treating as plain ANSI");
    iVar2 = INPUT_PLAIN;
  }
  this->input_type_ = iVar2;
  return;
}

Assistant:

void t_html_generator::detect_input_encoding(std::string const& str, size_t firstpos) {
  if (is_utf8_sequence(str, firstpos)) {
    pdebug("Input seems to be already UTF-8 encoded");
    input_type_ = INPUT_UTF8;
    return;
  }

  // fallback
  pwarning(1, "Input is not UTF-8, treating as plain ANSI");
  input_type_ = INPUT_PLAIN;
}